

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_short_&,_const_short_&> * __thiscall
Catch::ExprLhs<short_const&>::operator==
          (BinaryExpr<const_short_&,_const_short_&> *__return_storage_ptr__,
          ExprLhs<short_const&> *this,short *rhs)

{
  short sVar1;
  short sVar2;
  short *psVar3;
  StringRef local_40;
  
  psVar3 = *(short **)this;
  sVar1 = *psVar3;
  sVar2 = *rhs;
  StringRef::StringRef(&local_40,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = sVar1 == sVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001d09c8;
  __return_storage_ptr__->m_lhs = psVar3;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }